

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_to_bytes(wally_psbt *psbt,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  uint32_t flags_00;
  int iVar1;
  wally_psbt_output *output;
  wally_psbt_input *input;
  int ret;
  uint32_t tx_flags;
  size_t is_elements;
  size_t i;
  size_t max;
  uchar *cursor;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  wally_psbt *pwStack_18;
  uint32_t flags_local;
  wally_psbt *psbt_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((flags == 0) && (written != (size_t *)0x0)) {
    i = len;
    max = (size_t)bytes_out;
    cursor = (uchar *)written;
    written_local = (size_t *)len;
    len_local = (size_t)bytes_out;
    bytes_out_local._4_4_ = flags;
    pwStack_18 = psbt;
    psbt_local._4_4_ = wally_psbt_is_elements(psbt,(size_t *)&ret);
    if (psbt_local._4_4_ == 0) {
      flags_00 = 0;
      if (_ret != 0) {
        flags_00 = 2;
      }
      push_bytes((uchar **)&max,&i,pwStack_18,5);
      push_psbt_key((uchar **)&max,&i,0,(void *)0x0,0);
      psbt_local._4_4_ = push_length_and_tx((uchar **)&max,&i,pwStack_18->tx,0xc);
      if (psbt_local._4_4_ == 0) {
        if (pwStack_18->version != 0) {
          push_psbt_key((uchar **)&max,&i,0xfb,(void *)0x0,0);
          push_varint((uchar **)&max,&i,4);
          push_le32((uchar **)&max,&i,pwStack_18->version);
        }
        push_map((uchar **)&max,&i,&pwStack_18->unknowns);
        push_u8((uchar **)&max,&i,'\0');
        for (is_elements = 0; is_elements < pwStack_18->num_inputs; is_elements = is_elements + 1) {
          iVar1 = push_psbt_input((uchar **)&max,&i,flags_00,pwStack_18->inputs + is_elements);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        for (is_elements = 0; is_elements < pwStack_18->num_outputs; is_elements = is_elements + 1)
        {
          iVar1 = push_psbt_output((uchar **)&max,&i,pwStack_18->outputs + is_elements);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (max == 0) {
          *(size_t *)cursor = (long)written_local + i;
        }
        else {
          *(size_t *)cursor = (long)written_local - i;
        }
        psbt_local._4_4_ = 0;
      }
    }
  }
  else {
    psbt_local._4_4_ = -2;
  }
  return psbt_local._4_4_;
}

Assistant:

int wally_psbt_to_bytes(const struct wally_psbt *psbt, uint32_t flags,
                        unsigned char *bytes_out, size_t len,
                        size_t *written)
{
    unsigned char *cursor = bytes_out;
    size_t max = len, i, is_elements;
    uint32_t tx_flags;
    int ret;

    if (written)
        *written = 0;

    if (flags != 0 || !written)
        return WALLY_EINVAL;

    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;

    tx_flags = is_elements ? WALLY_TX_FLAG_USE_ELEMENTS : 0;
    push_bytes(&cursor, &max, psbt->magic, sizeof(psbt->magic));

    /* Global tx */
    push_psbt_key(&cursor, &max, PSBT_GLOBAL_UNSIGNED_TX, NULL, 0);
    ret = push_length_and_tx(&cursor, &max, psbt->tx,
                             WALLY_TX_FLAG_ALLOW_PARTIAL | WALLY_TX_FLAG_PRE_BIP144);
    if (ret != WALLY_OK)
        return ret;

    /* version */
    if (psbt->version > 0) {
        push_psbt_key(&cursor, &max, PSBT_GLOBAL_VERSION, NULL, 0);
        push_varint(&cursor, &max, sizeof(uint32_t));
        push_le32(&cursor, &max, psbt->version);
    }

    /* Unknowns */
    push_map(&cursor, &max, &psbt->unknowns);

    /* Separator */
    push_u8(&cursor, &max, PSBT_SEPARATOR);

    /* Push each input and output */
    for (i = 0; i < psbt->num_inputs; ++i) {
        const struct wally_psbt_input *input = &psbt->inputs[i];
        if ((ret = push_psbt_input(&cursor, &max, tx_flags, input)) != WALLY_OK)
            return ret;
    }
    for (i = 0; i < psbt->num_outputs; ++i) {
        const struct wally_psbt_output *output = &psbt->outputs[i];
        if ((ret = push_psbt_output(&cursor, &max, output)) != WALLY_OK)
            return ret;
    }

    if (cursor == NULL) {
        /* Once cursor is NULL, max holds how many bytes we needed */
        *written = len + max;
    } else {
        *written = len - max;
    }

    return WALLY_OK;
}